

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printHex(uchar *value,int len)

{
  char *__s;
  size_t sVar1;
  ulong uVar2;
  uint uVar3;
  char buf [3];
  undefined2 local_2c;
  undefined1 local_2a;
  
  __s = ByteToHex(value,len);
  sVar1 = strlen(__s);
  local_2a = 0;
  local_2c = 0;
  uVar3 = (uint)(sVar1 >> 1);
  if (0 < (int)uVar3) {
    uVar2 = 0;
    do {
      local_2c = CONCAT11(__s[uVar2 * 2 + 1],__s[uVar2 * 2]);
      printf("%s ",&local_2c);
      uVar2 = uVar2 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar2);
  }
  putchar(10);
  if (__s != (char *)0x0) {
    operator_delete__(__s);
  }
  return;
}

Assistant:

void printHex(const unsigned char* value, const int len)
{
	char* data = ByteToHex(value, len);
	int strl = strlen(data) / 2;
	char buf[3] = { 0 };
	for (int i = 0; i < strl; ++i)
	{
		buf[0] = data[i * 2];
		buf[1] = data[i * 2 + 1];
		printf("%s ", buf);
	}
	printf("\n");
	delete[]data;
}